

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

int VP8LHuffmanTablesAllocate(int size,HuffmanTables *huffman_tables)

{
  void *pvVar1;
  long *in_RSI;
  undefined4 in_EDI;
  HuffmanTablesSegment *root;
  undefined4 in_stack_fffffffffffffffc;
  
  in_RSI[4] = (long)in_RSI;
  in_RSI[2] = 0;
  pvVar1 = WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffffc,in_EDI),(size_t)in_RSI);
  *in_RSI = (long)pvVar1;
  if (*in_RSI != 0) {
    in_RSI[1] = *in_RSI;
    *(undefined4 *)(in_RSI + 3) = in_EDI;
  }
  return (uint)(*in_RSI != 0);
}

Assistant:

int VP8LHuffmanTablesAllocate(int size, HuffmanTables* huffman_tables) {
  // Have 'segment' point to the first segment for now, 'root'.
  HuffmanTablesSegment* const root = &huffman_tables->root;
  huffman_tables->curr_segment = root;
  root->next = NULL;
  // Allocate root.
  root->start = (HuffmanCode*)WebPSafeMalloc(size, sizeof(*root->start));
  if (root->start == NULL) return 0;
  root->curr_table = root->start;
  root->size = size;
  return 1;
}